

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

void * CorUnix::CPalThread::ThreadEntry(void *pvParam)

{
  PAL_ERROR PVar1;
  BOOL BVar2;
  PalThreadType PVar3;
  DWORD dwExitCode;
  long lVar4;
  pthread_t pVar5;
  LPTHREAD_START_ROUTINE p_Var6;
  LPVOID pvVar7;
  DWORD retValue;
  LPVOID pvPar;
  PTHREAD_START_ROUTINE pfnStartRoutine;
  CPalThread *pThread;
  PAL_ERROR palError;
  void *pvParam_local;
  
  if (pvParam == (void *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ThreadEntry",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x5c4);
    fprintf(_stderr,"THREAD pointer is NULL!\n");
  }
  else {
    if ((g_Dbg_asserts_enabled != 0) && ((*(byte *)((long)pvParam + 0x168) & 1) != 1)) {
      DebugBreak();
    }
    lVar4 = syscall(0xba);
    *(long *)((long)pvParam + 0xb8) = lVar4;
    pVar5 = pthread_self();
    *(pthread_t *)((long)pvParam + 200) = pVar5;
    *(undefined4 *)((long)pvParam + 0xc0) = 0;
    PVar1 = RunPostCreateInitializers((CPalThread *)pvParam);
    if (PVar1 == 0) {
      BVar2 = GetCreateSuspended((CPalThread *)pvParam);
      if (BVar2 == 0) {
        SetStartStatus((CPalThread *)pvParam,true);
      }
      else {
        PVar1 = CThreadSuspensionInfo::InternalSuspendNewThreadFromData
                          ((CThreadSuspensionInfo *)((long)pvParam + 0x488),(CPalThread *)pvParam);
        if (PVar1 != 0) {
          fprintf(_stderr,"] %s %s:%d","ThreadEntry",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                  ,0x5ea);
          fprintf(_stderr,"Error %i attempting to suspend new thread\n",(ulong)PVar1);
          goto LAB_003d00a2;
        }
        (**(code **)(*g_pSynchronizationManager + 0x20))(g_pSynchronizationManager,pvParam);
      }
      CThreadSynchronizationInfo::SetThreadState
                ((CThreadSynchronizationInfo *)((long)pvParam + 0x170),TS_RUNNING);
      PVar3 = GetThreadType((CPalThread *)pvParam);
      if (PVar3 == UserCreatedThread) {
        LOADCallDllMain(2,(LPVOID)0x0);
      }
      p_Var6 = GetStartAddress((CPalThread *)pvParam);
      pvVar7 = GetStartParameter((CPalThread *)pvParam);
      dwExitCode = (*p_Var6)(pvVar7);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      ExitThread(dwExitCode);
    }
    fprintf(_stderr,"] %s %s:%d","ThreadEntry",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x5e0);
    fprintf(_stderr,"Error %i initializing thread data (post creation)\n",(ulong)PVar1);
  }
LAB_003d00a2:
  if (pvParam != (void *)0x0) {
    CThreadSynchronizationInfo::SetThreadState
              ((CThreadSynchronizationInfo *)((long)pvParam + 0x170),TS_FAILED);
    SetStartStatus((CPalThread *)pvParam,false);
  }
  return (void *)0x0;
}

Assistant:

void *
CPalThread::ThreadEntry(
    void *pvParam
    )
{
    PAL_ERROR palError;
    CPalThread *pThread;
    PTHREAD_START_ROUTINE pfnStartRoutine;
    LPVOID pvPar;
    DWORD retValue;

    pThread = reinterpret_cast<CPalThread*>(pvParam);

    if (NULL == pThread)
    {
        ASSERT("THREAD pointer is NULL!\n");
        goto fail;
    }

#if defined(FEATURE_PAL_SXS) && defined(_DEBUG)
     // We cannot assert yet, as we haven't set in this thread into the TLS, and so __ASSERT_ENTER
     // will fail if the assert fails and we'll crash.
     //_ASSERT_MSG(pThread->m_fInPal == 1, "New threads should always be in the PAL upon ThreadEntry.\n");
     if (g_Dbg_asserts_enabled && pThread->m_fInPal != 1)
         DebugBreak();
 #endif // FEATURE_PAL_SXS && _DEBUG

    pThread->m_threadId = THREADSilentGetCurrentThreadId();
    pThread->m_pthreadSelf = pthread_self();
#if HAVE_MACH_THREADS
    pThread->m_machPortSelf = pthread_mach_thread_np(pThread->m_pthreadSelf);
#endif
#if HAVE_THREAD_SELF
    pThread->m_dwLwpId = (DWORD) thread_self();
#elif HAVE__LWP_SELF
    pThread->m_dwLwpId = (DWORD) _lwp_self();
#else
    pThread->m_dwLwpId = 0;
#endif

    palError = pThread->RunPostCreateInitializers();
    if (NO_ERROR != palError)
    {
        ASSERT("Error %i initializing thread data (post creation)\n", palError);
        goto fail;
    }

    // Check if the thread should be started suspended.
    if (pThread->GetCreateSuspended())
    {
        palError = pThread->suspensionInfo.InternalSuspendNewThreadFromData(pThread);
        if (NO_ERROR != palError)
        {
            ASSERT("Error %i attempting to suspend new thread\n", palError);
            goto fail;
        }

        //
        // We need to run any APCs that have already been queued for
        // this thread.
        //

        (void) g_pSynchronizationManager->DispatchPendingAPCs(pThread);
    }
    else
    {
        //
        // All startup operations that might have failed have succeeded,
        // so thread creation is successful. Let CreateThread return.
        //

        pThread->SetStartStatus(TRUE);
    }

    pThread->synchronizationInfo.SetThreadState(TS_RUNNING);

    if (UserCreatedThread == pThread->GetThreadType())
    {
        /* Inform all loaded modules that a thread has been created */
        /* note : no need to take a critical section to serialize here; the loader
           will take the module critical section */
        LOADCallDllMain(DLL_THREAD_ATTACH, NULL);
    }

#ifdef PAL_PERF
    PERFAllocThreadInfo();
    PERFEnableThreadProfile(UserCreatedThread != pThread->GetThreadType());
#endif

    /* call the startup routine */
    pfnStartRoutine = pThread->GetStartAddress();
    pvPar = pThread->GetStartParameter();

    retValue = (*pfnStartRoutine)(pvPar);

    TRACE("Thread exited (%u)\n", retValue);
    ExitThread(retValue);

    /* Note: never get here */
    ASSERT("ExitThread failed!\n");
    for (;;);

fail:

    //
    // Notify InternalCreateThread that a failure occurred
    //

    if (NULL != pThread)
    {
        pThread->synchronizationInfo.SetThreadState(TS_FAILED);
        pThread->SetStartStatus(FALSE);
    }

    /* do not call ExitThread : we don't want to call DllMain(), and the thread
       isn't in a clean state (e.g. lpThread isn't in TLS). the cleanup work
       above should release all resources */
    return NULL;
}